

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryLightsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryLightsLoader::begin__light
          (LibraryLightsLoader *this,light__AttributeData *attributeData)

{
  Light *this_00;
  long *in_RSI;
  UniqueId *in_RDI;
  ClassId in_stack_0000008c;
  ParserChar *in_stack_00000090;
  IFilePartLoader *in_stack_00000098;
  String *in_stack_fffffffffffffee8;
  Light *in_stack_fffffffffffffef0;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [39];
  undefined1 local_59 [36];
  undefined1 local_35;
  UniqueId local_28;
  long *local_10;
  
  local_10 = in_RSI;
  this_00 = (Light *)operator_new(400);
  local_35 = 1;
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)384>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
  COLLADAFW::Light::Light(this_00,in_RDI);
  local_35 = 0;
  in_RDI[1].mObjectId = (ObjectId)this_00;
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  if (local_10[1] == 0) {
    if (*local_10 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      COLLADAFW::Light::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  else {
    in_stack_ffffffffffffff20 = (allocator<char> *)in_RDI[1].mObjectId;
    in_stack_ffffffffffffff28 = (char *)local_10[1];
    in_stack_ffffffffffffff30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    COLLADAFW::Light::setName(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
  }
  if (*local_10 != 0) {
    in_stack_fffffffffffffef0 = (Light *)in_RDI[1].mObjectId;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    COLLADAFW::Light::setOriginalId(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  IFilePartLoader::addToSidTree
            ((IFilePartLoader *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
             (char *)0xc3f4d5);
  return true;
}

Assistant:

bool LibraryLightsLoader::begin__light( const light__AttributeData& attributeData )
	{
		mCurrentLight = FW_NEW COLLADAFW::Light( createUniqueIdFromId( attributeData.id, COLLADAFW::Light::ID()));

		if ( attributeData.name )
			mCurrentLight->setName( (const char*) attributeData.name );
		else if ( attributeData.id )
			mCurrentLight->setName( (const char*) attributeData.id );

        if ( attributeData.id )
            mCurrentLight->setOriginalId ( (const char*)attributeData.id );

		addToSidTree( attributeData.id, 0);

		return true;	
	}